

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_io.c
# Opt level: O3

light_pcapng light_read_from_path(char *file_name)

{
  __fd_t fd;
  size_t __nmemb;
  uint32_t *memory;
  light_pcapng p_Var1;
  
  fd = light_open(file_name,LIGHT_OREAD);
  if (fd == (__fd_t)0x0) {
    light_read_from_path_cold_1();
  }
  else {
    __nmemb = light_size(fd);
    memory = (uint32_t *)calloc(__nmemb,1);
    if (memory != (uint32_t *)0x0) {
      light_read(fd,memory,__nmemb);
      p_Var1 = light_read_from_memory(memory,__nmemb);
      light_close(fd);
      free(memory);
      return p_Var1;
    }
    fprintf(_stderr,"Unable to alloc %zu bytes\n",__nmemb);
    light_close(fd);
  }
  return (light_pcapng)0x0;
}

Assistant:

light_pcapng light_read_from_path(const char *file_name)
{
	light_pcapng head;
	uint32_t *memory;
	size_t size = 0;
	__fd_t fd = light_open(file_name, LIGHT_OREAD);
	DCHECK_ASSERT_EXP(fd != NULL, "could not open file", return NULL);

	size = light_size(fd);
	// DCHECK_INT(size, 0, light_stop);

	memory = calloc(size, 1);
	if (memory == NULL) {
		fprintf(stderr, "Unable to alloc %zu bytes\n", size);
		light_close(fd);
		return NULL;
	}

	// DCHECK_INT(light_read(fd, memory, size), size - 1, light_stop);
	light_read(fd, memory, size);

	head = light_read_from_memory(memory, size);

	light_close(fd);
	free(memory);

	return head;
}